

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_info_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  size_t __size;
  uint uVar1;
  uchar *puVar2;
  ulong uVar3;
  size_t sVar4;
  char *orig;
  char *orig_1;
  uint i;
  size_t sVar5;
  long lVar6;
  undefined1 auVar7 [32];
  
  lodepng_info_cleanup(dest);
  memcpy(dest,source,0x138);
  (dest->color).colortype = LCT_RGBA;
  (dest->color).bitdepth = 8;
  (dest->color).palette = (uchar *)0x0;
  (dest->color).palettesize = 0;
  (dest->color).key_defined = 0;
  (dest->color).key_r = 0;
  (dest->color).key_g = 0;
  (dest->color).key_b = 0;
  uVar1 = lodepng_color_mode_copy(&dest->color,&source->color);
  if (uVar1 == 0) {
    dest->text_num = 0;
    dest->text_keys = (char **)0x0;
    dest->text_strings = (char **)0x0;
    if (source->text_num != 0) {
      sVar5 = 0;
      do {
        sVar4 = 0xffffffffffffffff;
        do {
          lVar6 = sVar4 + 1;
          sVar4 = sVar4 + 1;
        } while (source->text_strings[sVar5][lVar6] != '\0');
        uVar1 = lodepng_add_text_sized
                          (dest,source->text_keys[sVar5],source->text_strings[sVar5],sVar4);
        if (uVar1 != 0) {
          return uVar1;
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != source->text_num);
    }
    auVar7 = ZEXT1632(ZEXT816(0) << 0x40);
    dest->itext_num = auVar7._0_8_;
    dest->itext_keys = (char **)auVar7._8_8_;
    dest->itext_langtags = (char **)auVar7._16_8_;
    dest->itext_transkeys = (char **)auVar7._24_8_;
    dest->itext_strings = (char **)0x0;
    if (source->itext_num != 0) {
      sVar5 = 0;
      do {
        sVar4 = 0xffffffffffffffff;
        do {
          lVar6 = sVar4 + 1;
          sVar4 = sVar4 + 1;
        } while (source->itext_strings[sVar5][lVar6] != '\0');
        uVar1 = lodepng_add_itext_sized
                          (dest,source->itext_keys[sVar5],source->itext_langtags[sVar5],
                           source->itext_transkeys[sVar5],source->itext_strings[sVar5],sVar4);
        if (uVar1 != 0) {
          return uVar1;
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != source->itext_num);
    }
    if ((source->iccp_defined != 0) &&
       (uVar1 = lodepng_assign_icc(dest,source->iccp_name,source->iccp_profile,
                                   source->iccp_profile_size), uVar1 != 0)) {
      return uVar1;
    }
    dest->unknown_chunks_data[2] = (uchar *)0x0;
    dest->unknown_chunks_size[0] = 0;
    dest->unknown_chunks_size[1] = 0;
    dest->unknown_chunks_size[2] = 0;
    dest->unknown_chunks_data[0] = (uchar *)0x0;
    dest->unknown_chunks_data[1] = (uchar *)0x0;
    dest->unknown_chunks_data[2] = (uchar *)0x0;
    dest->unknown_chunks_size[0] = 0;
    lVar6 = 0;
    do {
      free(dest->unknown_chunks_data[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar6 = 0;
    do {
      __size = source->unknown_chunks_size[lVar6];
      dest->unknown_chunks_size[lVar6] = __size;
      puVar2 = (uchar *)malloc(__size);
      dest->unknown_chunks_data[lVar6] = puVar2;
      if (__size != 0 && puVar2 == (uchar *)0x0) {
        return 0x53;
      }
      if (__size != 0) {
        uVar3 = 0;
        do {
          dest->unknown_chunks_data[lVar6][uVar3] = source->unknown_chunks_data[lVar6][uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 < source->unknown_chunks_size[lVar6]);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned lodepng_info_copy(LodePNGInfo* dest, const LodePNGInfo* source) {
  lodepng_info_cleanup(dest);
  lodepng_memcpy(dest, source, sizeof(LodePNGInfo));
  lodepng_color_mode_init(&dest->color);
  CERROR_TRY_RETURN(lodepng_color_mode_copy(&dest->color, &source->color));

#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  CERROR_TRY_RETURN(LodePNGText_copy(dest, source));
  CERROR_TRY_RETURN(LodePNGIText_copy(dest, source));
  if (source->iccp_defined) {
    CERROR_TRY_RETURN(lodepng_assign_icc(dest, source->iccp_name, source->iccp_profile, source->iccp_profile_size));
  }

  LodePNGUnknownChunks_init(dest);
  CERROR_TRY_RETURN(LodePNGUnknownChunks_copy(dest, source));
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  return 0;
}